

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_StringTemplateInclude::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  char cVar5;
  Template *pTVar6;
  string expected;
  string cache_key_indent;
  string cache_key_inc;
  string cache_key;
  TemplateDictionary dict;
  uint7 uStack_ff;
  string text_indent;
  string text_inc;
  string text;
  TemplateString local_90;
  TemplateString local_70;
  TemplateString local_50;
  TemplateString local_30;
  
  ctemplate::Template::ClearCache();
  std::__cxx11::string::string((string *)&cache_key,"TestStringTemplateInclude",(allocator *)&dict);
  std::__cxx11::string::string
            ((string *)&cache_key_inc,"TestStringTemplateInclude-inc",(allocator *)&dict);
  std::__cxx11::string::string
            ((string *)&cache_key_indent,"TestStringTemplateInclude-indent",(allocator *)&dict);
  std::__cxx11::string::string((string *)&text,"<html>{{>INC}}</html>",(allocator *)&dict);
  std::__cxx11::string::string
            ((string *)&text_inc,"<div>\n<p>\nUser {{USER}}\n</div>",(allocator *)&dict);
  std::__cxx11::string::string
            ((string *)&text_indent,"<html>\n  {{>INC}}</html>",(allocator *)&dict);
  _dict = cache_key._M_dataplus._M_p;
  expected._M_dataplus = text._M_dataplus;
  expected._M_string_length = text._M_string_length;
  expected.field_2._M_local_buf[0] = '\0';
  expected.field_2._8_8_ = 0;
  cVar5 = ctemplate::Template::StringToTemplateCache
                    ((TemplateString *)&dict,(TemplateString *)&expected);
  if (cVar5 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x4b5,"Template::StringToTemplateCache(cache_key, text)");
    _dict = cache_key._M_dataplus._M_p;
    expected._M_dataplus = text._M_dataplus;
    expected._M_string_length = text._M_string_length;
    expected.field_2._M_local_buf[0] = '\0';
    expected.field_2._8_8_ = 0;
    cVar5 = ctemplate::Template::StringToTemplateCache
                      ((TemplateString *)&dict,(TemplateString *)&expected);
    if (cVar5 == '\0') {
      __assert_fail("Template::StringToTemplateCache(cache_key, text)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4b5,"static void Test_Template_StringTemplateInclude::Run()");
    }
  }
  else {
    _dict = cache_key_inc._M_dataplus._M_p;
    expected._M_dataplus = text_inc._M_dataplus;
    expected._M_string_length = text_inc._M_string_length;
    expected.field_2._M_local_buf[0] = '\0';
    expected.field_2._8_8_ = 0;
    cVar5 = ctemplate::Template::StringToTemplateCache
                      ((TemplateString *)&dict,(TemplateString *)&expected);
    if (cVar5 == '\0') {
      printf("ASSERT FAILED, line %d: %s\n",0x4b6,
             "Template::StringToTemplateCache(cache_key_inc, text_inc)");
      _dict = cache_key_inc._M_dataplus._M_p;
      expected._M_dataplus = text_inc._M_dataplus;
      expected._M_string_length = text_inc._M_string_length;
      expected.field_2._M_local_buf[0] = '\0';
      expected.field_2._8_8_ = 0;
      cVar5 = ctemplate::Template::StringToTemplateCache
                        ((TemplateString *)&dict,(TemplateString *)&expected);
      if (cVar5 == '\0') {
        __assert_fail("Template::StringToTemplateCache(cache_key_inc, text_inc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x4b6,"static void Test_Template_StringTemplateInclude::Run()");
      }
    }
    else {
      _dict = cache_key_indent._M_dataplus._M_p;
      expected._M_dataplus = text_indent._M_dataplus;
      expected._M_string_length = text_indent._M_string_length;
      expected.field_2._M_local_buf[0] = '\0';
      expected.field_2._8_8_ = 0;
      cVar5 = ctemplate::Template::StringToTemplateCache
                        ((TemplateString *)&dict,(TemplateString *)&expected);
      if (cVar5 != '\0') {
        _dict = cache_key._M_dataplus._M_p;
        pTVar6 = (Template *)ctemplate::Template::GetTemplate((TemplateString *)&dict,DO_NOT_STRIP);
        if (pTVar6 == (Template *)0x0) {
          printf("ASSERT FAILED, line %d: %s\n",0x4ba,"tpl");
          __assert_fail("tpl",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x4ba,"static void Test_Template_StringTemplateInclude::Run()");
        }
        ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"dict");
        ctemplate::TemplateDictionary::TemplateDictionary
                  (&dict,(TemplateString *)&expected,(UnsafeArena *)0x0);
        ctemplate::TemplateString::TemplateString(&local_50,"INC");
        TVar1.length_ = local_50.length_;
        TVar1.ptr_ = local_50.ptr_;
        TVar1.is_immutable_ = local_50.is_immutable_;
        TVar1._17_7_ = local_50._17_7_;
        TVar1.id_ = local_50.id_;
        ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
        TVar2.length_ = cache_key_inc._M_string_length;
        TVar2.ptr_ = cache_key_inc._M_dataplus._M_p;
        TVar2._16_8_ = (ulong)uStack_ff << 8;
        TVar2.id_ = 0;
        ctemplate::TemplateDictionary::SetFilename(TVar2);
        ctemplate::TemplateString::TemplateString(&local_70,"USER");
        ctemplate::TemplateString::TemplateString(&local_90,"John<>Doe");
        TVar3.length_ = local_70.length_;
        TVar3.ptr_ = local_70.ptr_;
        TVar3.is_immutable_ = local_70.is_immutable_;
        TVar3._17_7_ = local_70._17_7_;
        TVar3.id_ = local_70.id_;
        TVar4.length_ = local_90.length_;
        TVar4.ptr_ = local_90.ptr_;
        TVar4.is_immutable_ = local_90.is_immutable_;
        TVar4._17_7_ = local_90._17_7_;
        TVar4.id_ = local_90.id_;
        ctemplate::TemplateDictionary::SetValue(TVar3,TVar4);
        std::__cxx11::string::string
                  ((string *)&expected,"<html><div>\n<p>\nUser John<>Doe\n</div></html>",
                   (allocator *)&local_30);
        ctemplate::AssertExpandIs(pTVar6,&dict,&expected,true);
        local_30.ptr_ = cache_key_indent._M_dataplus._M_p;
        local_30.length_ = cache_key_indent._M_string_length;
        local_30.is_immutable_ = false;
        local_30.id_ = 0;
        pTVar6 = (Template *)ctemplate::Template::GetTemplate(&local_30,DO_NOT_STRIP);
        if (pTVar6 != (Template *)0x0) {
          std::__cxx11::string::assign((char *)&expected);
          ctemplate::AssertExpandIs(pTVar6,&dict,&expected,true);
          ctemplate::Template::ClearCache();
          std::__cxx11::string::~string((string *)&expected);
          ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
          std::__cxx11::string::~string((string *)&text_indent);
          std::__cxx11::string::~string((string *)&text_inc);
          std::__cxx11::string::~string((string *)&text);
          std::__cxx11::string::~string((string *)&cache_key_indent);
          std::__cxx11::string::~string((string *)&cache_key_inc);
          std::__cxx11::string::~string((string *)&cache_key);
          return;
        }
        printf("ASSERT FAILED, line %d: %s\n",0x4c7,"tpl");
        __assert_fail("tpl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x4c7,"static void Test_Template_StringTemplateInclude::Run()");
      }
      printf("ASSERT FAILED, line %d: %s\n",0x4b7,
             "Template::StringToTemplateCache(cache_key_indent, text_indent)");
      _dict = cache_key_indent._M_dataplus._M_p;
      expected._M_dataplus = text_indent._M_dataplus;
      expected._M_string_length = text_indent._M_string_length;
      expected.field_2._M_local_buf[0] = '\0';
      expected.field_2._8_8_ = 0;
      cVar5 = ctemplate::Template::StringToTemplateCache
                        ((TemplateString *)&dict,(TemplateString *)&expected);
      if (cVar5 == '\0') {
        __assert_fail("Template::StringToTemplateCache(cache_key_indent, text_indent)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x4b7,"static void Test_Template_StringTemplateInclude::Run()");
      }
    }
  }
  exit(1);
}

Assistant:

TEST(Template, StringTemplateInclude) {
  Template::ClearCache();   // just for exercise.
  const string cache_key = "TestStringTemplateInclude";
  const string cache_key_inc = "TestStringTemplateInclude-inc";
  const string cache_key_indent = "TestStringTemplateInclude-indent";
  const string text = "<html>{{>INC}}</html>";
  const string text_inc = "<div>\n<p>\nUser {{USER}}\n</div>";
  const string text_indent = "<html>\n  {{>INC}}</html>";

  ASSERT(Template::StringToTemplateCache(cache_key, text));
  ASSERT(Template::StringToTemplateCache(cache_key_inc, text_inc));
  ASSERT(Template::StringToTemplateCache(cache_key_indent, text_indent));

  Template *tpl = Template::GetTemplate(cache_key, DO_NOT_STRIP);
  ASSERT(tpl);

  TemplateDictionary dict("dict");
  TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
  sub_dict->SetFilename(cache_key_inc);

  sub_dict->SetValue("USER", "John<>Doe");
  string expected = "<html><div>\n<p>\nUser John<>Doe\n</div></html>";
  AssertExpandIs(tpl, &dict, expected, true);

  // Repeat the same except that now the parent has a template-level
  // directive (by way of the automatic-line-indenter).
  tpl = Template::GetTemplate(cache_key_indent, DO_NOT_STRIP);
  ASSERT(tpl);
  expected =
      "<html>\n"
      "  <div>\n"
      "  <p>\n"
      "  User John<>Doe\n"
      "  </div>"
      "</html>";
  AssertExpandIs(tpl, &dict, expected, true);

  Template::ClearCache();
}